

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.hh
# Opt level: O0

void __thiscall kratos::IfStmt::~IfStmt(IfStmt *this)

{
  IfStmt *this_local;
  
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_005881b0;
  std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr(&this->else_body_);
  std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr(&this->then_body_);
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr(&this->predicate_stmt_);
  std::shared_ptr<kratos::Var>::~shared_ptr(&this->predicate_);
  Stmt::~Stmt(&this->super_Stmt);
  return;
}

Assistant:

explicit IfStmt(Var &var) : IfStmt(var.shared_from_this()) {}